

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O0

iterator __thiscall
estl::vector_s<unsigned_int,12ul>::insert<unsigned_int_const*>
          (vector_s<unsigned_int,12ul> *this,const_iterator pos,uint *first,uint *last)

{
  size_type n;
  out_of_range *this_00;
  size_type sVar1;
  size_type sVar2;
  range_error *this_01;
  iterator last_00;
  pointer insert_ptr;
  uint *it;
  iterator ipos;
  iterator ipos_start;
  size_type new_size;
  size_type count;
  int64_t count_signed;
  uint *last_local;
  uint *first_local;
  const_iterator pos_local;
  vector_s<unsigned_int,_12UL> *this_local;
  
  n = (long)last - (long)first >> 2;
  if ((long)n < 0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range
              (this_00,"cas::vector_s range constructing/assigning from inverted range.");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  sVar1 = vector_s<unsigned_int,_12UL>::size((vector_s<unsigned_int,_12UL> *)this);
  sVar2 = vector_s<unsigned_int,_12UL>::capacity((vector_s<unsigned_int,_12UL> *)this);
  if (sVar2 < sVar1 + n) {
    this_01 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_01,"cas::vector_s inserting beyond capacity.");
    __cxa_throw(this_01,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  last_00 = vector_s<unsigned_int,_12UL>::end((vector_s<unsigned_int,_12UL> *)this);
  shift_right<unsigned_int*>(this,pos,last_00,n);
  it = pos;
  for (insert_ptr = first; insert_ptr != last; insert_ptr = insert_ptr + 1) {
    *it = *insert_ptr;
    it = it + 1;
  }
  *(size_type *)this = sVar1 + n;
  return pos;
}

Assistant:

iterator insert (const_iterator pos, InputIt first, InputIt last)
    {
        const std::int64_t count_signed = last - first;
        if (count_signed < 0) {
            ESTL_THROW (std::out_of_range, "cas::vector_s range constructing/assigning from inverted range.");
            return end();
        }
        const size_type count = static_cast<size_type>(count_signed);
        const size_type new_size = size() + count;
        if (new_size > capacity()) {
            ESTL_THROW (std::range_error, "cas::vector_s inserting beyond capacity.");
            return end();
        }

        const iterator ipos_start = const_cast<iterator>(pos);
        iterator ipos = ipos_start;
        shift_right(ipos, end(), count);
        for (InputIt it = first; it != last; ++it, ++ipos) {
            const pointer insert_ptr = static_cast<pointer>(ipos);
            new (insert_ptr) value_type(*it);
            // *ipos = *it; // TODO: This seems ok too since the extra elements are already "allocated" by shift_right
        }
        size_ = new_size;
        return ipos_start;
    }